

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O2

string * core::image::anon_unknown_0::debug_print(string *__return_storage_ptr__,string *value)

{
  allocator local_11;
  
  if (value->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<not set>",&local_11);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    debug_print (std::string const& value)
    {
        if (value.empty())
            return "<not set>";
        else
            return value;
    }